

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

int cmSystemTools::WaitForLine
              (cmsysProcess *process,string *line,double timeout,
              vector<char,_std::allocator<char>_> *out,vector<char,_std::allocator<char>_> *err)

{
  char cVar1;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  pointer pcVar6;
  char *pcVar7;
  char *pcVar8;
  difference_type __offset_2;
  char *pcVar9;
  difference_type __offset;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  cmProcessOutput processOutput;
  int length;
  string strdata;
  char *data;
  cmProcessOutput local_b9;
  int local_b8;
  int local_b4;
  string *local_b0;
  string local_a8;
  char *local_88;
  string local_80;
  string local_60;
  cmsysProcess *local_40;
  double local_38;
  
  local_b0 = line;
  local_40 = process;
  local_38 = timeout;
  std::__cxx11::string::_M_replace((ulong)line,0,(char *)line->_M_string_length,0x58e58e);
  pcVar8 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar7 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  cmProcessOutput::cmProcessOutput(&local_b9,Auto,0x400);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  do {
    pcVar9 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    pcVar10 = pcVar8;
    if (pcVar8 != pcVar9) {
      lVar12 = 0;
      do {
        pcVar11 = pcVar8 + lVar12 + 1;
        cVar1 = pcVar8[lVar12];
        if (cVar1 == '\r') {
          if (pcVar11 == pcVar9) {
            pcVar10 = pcVar8 + lVar12;
            break;
          }
        }
        else if ((cVar1 == '\0') || (cVar1 == '\n')) {
          pcVar6 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar7 = pcVar8 + (lVar12 - (long)pcVar6);
          if ((char *)0x1 < pcVar7) {
            pcVar7 = pcVar8 + (lVar12 - (long)(pcVar6 + (pcVar8[lVar12 + -1] == '\r')));
          }
          if (pcVar7 != (char *)0x0) {
            std::__cxx11::string::append((char *)local_b0,(ulong)pcVar6);
          }
          pcVar7 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          local_b8 = 2;
          if (pcVar11 != pcVar7) {
            pcVar9 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            if (pcVar11 != pcVar9) {
              memmove(pcVar7,pcVar11,(size_t)(pcVar9 + (~(ulong)pcVar8 - lVar12)));
            }
            pcVar9 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            if (pcVar7 + (long)pcVar9 + (~(ulong)pcVar8 - lVar12) != pcVar9) {
              (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_finish = pcVar7 + (long)pcVar9 + (~(ulong)pcVar8 - lVar12);
            }
          }
          goto LAB_00273bb6;
        }
        lVar12 = lVar12 + 1;
        pcVar10 = pcVar9;
      } while (pcVar11 != pcVar9);
    }
    pcVar8 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    pcVar9 = pcVar7;
    if (pcVar7 != pcVar8) {
      lVar12 = 0;
      do {
        pcVar11 = pcVar7 + lVar12 + 1;
        cVar1 = pcVar7[lVar12];
        if (cVar1 == '\r') {
          if (pcVar11 == pcVar8) {
            pcVar9 = pcVar7 + lVar12;
            break;
          }
        }
        else if ((cVar1 == '\0') || (cVar1 == '\n')) {
          pcVar6 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar8 = pcVar7 + (lVar12 - (long)pcVar6);
          if ((char *)0x1 < pcVar8) {
            pcVar8 = pcVar7 + (lVar12 - (long)(pcVar6 + (pcVar7[lVar12 + -1] == '\r')));
          }
          if (pcVar8 != (char *)0x0) {
            std::__cxx11::string::append((char *)local_b0,(ulong)pcVar6);
          }
          pcVar8 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          local_b8 = 3;
          if (pcVar11 != pcVar8) {
            pcVar9 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            if (pcVar11 != pcVar9) {
              memmove(pcVar8,pcVar11,(size_t)(pcVar9 + (~(ulong)pcVar7 - lVar12)));
            }
            pcVar9 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            if (pcVar8 + (long)pcVar9 + (~(ulong)pcVar7 - lVar12) != pcVar9) {
              (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_finish = pcVar8 + (long)pcVar9 + (~(ulong)pcVar7 - lVar12);
            }
          }
          goto LAB_00273bb6;
        }
        lVar12 = lVar12 + 1;
        pcVar9 = pcVar8;
      } while (pcVar11 != pcVar8);
    }
    iVar5 = cmsysProcess_WaitForData(local_40,&local_88,&local_b4,&local_38);
    if (iVar5 < 3) {
      if (iVar5 != 0) {
        if (iVar5 == 2) {
          cmProcessOutput::DecodeText(&local_b9,local_88,(long)local_b4,&local_a8,1);
          pcVar6 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          pcVar2 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          std::vector<char,std::allocator<char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((vector<char,std::allocator<char>> *)out,pcVar6,local_a8._M_dataplus._M_p,
                     local_a8._M_dataplus._M_p + local_a8._M_string_length);
          pcVar10 = pcVar6 + ((long)(out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                    super__Vector_impl_data._M_start - (long)pcVar2);
        }
        goto LAB_00273a57;
      }
      local_60._M_string_length = 0;
      local_60.field_2._M_local_buf[0] = '\0';
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      cmProcessOutput::DecodeText(&local_b9,&local_60,&local_a8,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
      }
      if (local_a8._M_string_length != 0) {
        pcVar6 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pcVar2 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        std::vector<char,std::allocator<char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((vector<char,std::allocator<char>> *)out,pcVar6,local_a8._M_dataplus._M_p,
                   local_a8._M_dataplus._M_p + local_a8._M_string_length);
        pcVar10 = pcVar6 + ((long)(out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                  super__Vector_impl_data._M_start - (long)pcVar2);
      }
      local_80._M_string_length = 0;
      local_80.field_2._M_local_buf[0] = '\0';
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      cmProcessOutput::DecodeText(&local_b9,&local_80,&local_a8,2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,
                        CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                 local_80.field_2._M_local_buf[0]) + 1);
      }
      if (local_a8._M_string_length != 0) {
        pcVar6 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pcVar2 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        std::vector<char,std::allocator<char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((vector<char,std::allocator<char>> *)err);
        pcVar9 = pcVar6 + ((long)(err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                 super__Vector_impl_data._M_start - (long)pcVar2);
      }
      pcVar6 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pcVar6 == (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_finish) {
        pcVar6 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pcVar6 == (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish) {
          bVar4 = false;
          local_b8 = 0;
          goto LAB_00273aa0;
        }
        std::__cxx11::string::append((char *)local_b0,(ulong)pcVar6);
        pcVar6 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar2 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        local_b8 = 3;
        if ((pcVar6 != pcVar2) &&
           (pcVar3 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish,
           pcVar6 = pcVar6 + ((long)pcVar3 - (long)pcVar2), pcVar3 != pcVar6)) {
          (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_finish = pcVar6;
        }
      }
      else {
        std::__cxx11::string::append((char *)local_b0,(ulong)pcVar6);
        pcVar6 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar2 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        local_b8 = 2;
        if ((pcVar6 != pcVar2) &&
           (pcVar3 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish,
           pcVar6 = pcVar6 + ((long)pcVar3 - (long)pcVar2), pcVar3 != pcVar6)) {
          (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_finish = pcVar6;
        }
      }
      bVar4 = false;
    }
    else {
      if (iVar5 == 3) {
        cmProcessOutput::DecodeText(&local_b9,local_88,(long)local_b4,&local_a8,2);
        pcVar6 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pcVar2 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        std::vector<char,std::allocator<char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((vector<char,std::allocator<char>> *)err,pcVar6,local_a8._M_dataplus._M_p,
                   local_a8._M_dataplus._M_p + local_a8._M_string_length);
        pcVar9 = pcVar6 + ((long)(err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                 super__Vector_impl_data._M_start - (long)pcVar2);
      }
      else if (iVar5 == 0xff) {
        bVar4 = false;
        local_b8 = 0xff;
        goto LAB_00273aa0;
      }
LAB_00273a57:
      bVar4 = true;
    }
LAB_00273aa0:
    pcVar7 = pcVar9;
    pcVar8 = pcVar10;
    if (!bVar4) {
LAB_00273bb6:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                 local_a8.field_2._M_local_buf[0]) + 1);
      }
      cmProcessOutput::~cmProcessOutput(&local_b9);
      return local_b8;
    }
  } while( true );
}

Assistant:

int cmSystemTools::WaitForLine(cmsysProcess* process, std::string& line,
                               double timeout, std::vector<char>& out,
                               std::vector<char>& err)
{
  line = "";
  std::vector<char>::iterator outiter = out.begin();
  std::vector<char>::iterator erriter = err.begin();
  cmProcessOutput processOutput;
  std::string strdata;
  while (true) {
    // Check for a newline in stdout.
    for (; outiter != out.end(); ++outiter) {
      if ((*outiter == '\r') && ((outiter + 1) == out.end())) {
        break;
      }
      if (*outiter == '\n' || *outiter == '\0') {
        std::vector<char>::size_type length = outiter - out.begin();
        if (length > 1 && *(outiter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(&out[0], length);
        }
        out.erase(out.begin(), outiter + 1);
        return cmsysProcess_Pipe_STDOUT;
      }
    }

    // Check for a newline in stderr.
    for (; erriter != err.end(); ++erriter) {
      if ((*erriter == '\r') && ((erriter + 1) == err.end())) {
        break;
      }
      if (*erriter == '\n' || *erriter == '\0') {
        std::vector<char>::size_type length = erriter - err.begin();
        if (length > 1 && *(erriter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(&err[0], length);
        }
        err.erase(err.begin(), erriter + 1);
        return cmsysProcess_Pipe_STDERR;
      }
    }

    // No newlines found.  Wait for more data from the process.
    int length;
    char* data;
    int pipe = cmsysProcess_WaitForData(process, &data, &length, &timeout);
    if (pipe == cmsysProcess_Pipe_Timeout) {
      // Timeout has been exceeded.
      return pipe;
    }
    if (pipe == cmsysProcess_Pipe_STDOUT) {
      processOutput.DecodeText(data, length, strdata, 1);
      // Append to the stdout buffer.
      std::vector<char>::size_type size = out.size();
      out.insert(out.end(), strdata.begin(), strdata.end());
      outiter = out.begin() + size;
    } else if (pipe == cmsysProcess_Pipe_STDERR) {
      processOutput.DecodeText(data, length, strdata, 2);
      // Append to the stderr buffer.
      std::vector<char>::size_type size = err.size();
      err.insert(err.end(), strdata.begin(), strdata.end());
      erriter = err.begin() + size;
    } else if (pipe == cmsysProcess_Pipe_None) {
      // Both stdout and stderr pipes have broken.  Return leftover data.
      processOutput.DecodeText(std::string(), strdata, 1);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = out.size();
        out.insert(out.end(), strdata.begin(), strdata.end());
        outiter = out.begin() + size;
      }
      processOutput.DecodeText(std::string(), strdata, 2);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = err.size();
        err.insert(err.end(), strdata.begin(), strdata.end());
        erriter = err.begin() + size;
      }
      if (!out.empty()) {
        line.append(&out[0], outiter - out.begin());
        out.erase(out.begin(), out.end());
        return cmsysProcess_Pipe_STDOUT;
      }
      if (!err.empty()) {
        line.append(&err[0], erriter - err.begin());
        err.erase(err.begin(), err.end());
        return cmsysProcess_Pipe_STDERR;
      }
      return cmsysProcess_Pipe_None;
    }
  }
}